

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::StreamWriter::Write
          (StreamWriter *this,char *a_pBuf)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = this->m_ostream;
  if (a_pBuf != (char *)0x0) {
    sVar2 = strlen(a_pBuf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,a_pBuf,sVar2);
    return;
  }
  std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  return;
}

Assistant:

void Write(const char * a_pBuf) {
            m_ostream << a_pBuf;
        }